

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
* vkt::sr::anon_unknown_0::generateCubeCaseIterations
            (vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  int iVar1;
  CubeFace CVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  GatherCubeArgs local_b8;
  int local_88;
  int basicNdx_1;
  GatherCubeArgs local_78;
  int local_50;
  CubeFace local_4c;
  int basicNdx;
  CubeFace cubeFace;
  int cubeFaceI;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  IVec2 *offsetRange_local;
  TextureFormat *textureFormat_local;
  GatherType gatherType_local;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  *iterations;
  
  basicIterations.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)offsetRange;
  generateBasic2DCaseIterations
            ((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
              *)&cubeFaceI,gatherType,textureFormat,offsetRange);
  cubeFace._3_1_ = CUBEFACE_NEGATIVE_X >> 0x18;
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ::vector(__return_storage_ptr__);
  basicNdx = 0;
  do {
    if (5 < basicNdx) {
      cubeFace._3_1_ = 1;
      std::
      vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ::~vector((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                 *)&cubeFaceI);
      return __return_storage_ptr__;
    }
    local_4c = basicNdx;
    if (basicNdx == 0) {
      for (local_50 = 0; iVar1 = local_50,
          sVar4 = std::
                  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                  ::size((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          *)&cubeFaceI), iVar1 < (int)sVar4; local_50 = local_50 + 1) {
        local_78.gatherArgs.offsets[1].m_data[1] = 0;
        local_78.gatherArgs.offsets[2].m_data[0] = 0;
        local_78.gatherArgs.offsets[2].m_data[1] = 0;
        local_78.gatherArgs.offsets[3].m_data[0] = 0;
        local_78.gatherArgs.componentNdx = 0;
        local_78.gatherArgs.offsets[0].m_data[0] = 0;
        local_78.gatherArgs.offsets[0].m_data[1] = 0;
        local_78.gatherArgs.offsets[1].m_data[0] = 0;
        local_78.gatherArgs.offsets[3].m_data[1] = 0;
        local_78.face = CUBEFACE_NEGATIVE_X;
        GatherCubeArgs::GatherCubeArgs(&local_78);
        std::
        vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
        ::push_back(__return_storage_ptr__,&local_78);
        pvVar5 = std::
                 vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                 ::operator[]((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                               *)&cubeFaceI,(long)local_50);
        pvVar6 = std::
                 vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                 ::back(__return_storage_ptr__);
        memcpy(pvVar6,pvVar5,0x24);
        CVar2 = local_4c;
        pvVar6 = std::
                 vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                 ::back(__return_storage_ptr__);
        pvVar6->face = CVar2;
      }
    }
    else {
      for (local_88 = 0; iVar1 = local_88,
          sVar4 = std::
                  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                  ::size((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          *)&cubeFaceI), iVar1 < (int)sVar4; local_88 = local_88 + 1) {
        bVar3 = isDepthFormat(textureFormat);
        if ((bVar3) ||
           (pvVar5 = std::
                     vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                     ::operator[]((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                   *)&cubeFaceI,(long)local_88),
           pvVar5->componentNdx == basicNdx % 4)) {
          local_b8.gatherArgs.offsets[1].m_data[1] = 0;
          local_b8.gatherArgs.offsets[2].m_data[0] = 0;
          local_b8.gatherArgs.offsets[2].m_data[1] = 0;
          local_b8.gatherArgs.offsets[3].m_data[0] = 0;
          local_b8.gatherArgs.componentNdx = 0;
          local_b8.gatherArgs.offsets[0].m_data[0] = 0;
          local_b8.gatherArgs.offsets[0].m_data[1] = 0;
          local_b8.gatherArgs.offsets[1].m_data[0] = 0;
          local_b8.gatherArgs.offsets[3].m_data[1] = 0;
          local_b8.face = CUBEFACE_NEGATIVE_X;
          GatherCubeArgs::GatherCubeArgs(&local_b8);
          std::
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          ::push_back(__return_storage_ptr__,&local_b8);
          pvVar5 = std::
                   vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                   ::operator[]((vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                 *)&cubeFaceI,(long)local_88);
          pvVar6 = std::
                   vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   ::back(__return_storage_ptr__);
          memcpy(pvVar6,pvVar5,0x24);
          CVar2 = local_4c;
          pvVar6 = std::
                   vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   ::back(__return_storage_ptr__);
          pvVar6->face = CVar2;
          break;
        }
      }
    }
    basicNdx = basicNdx + 1;
  } while( true );
}

Assistant:

vector<GatherCubeArgs> generateCubeCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const vector<GatherArgs>	basicIterations = generateBasic2DCaseIterations(gatherType, textureFormat, offsetRange);
	vector<GatherCubeArgs>		iterations;

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				iterations.push_back(GatherCubeArgs());
				iterations.back().gatherArgs = basicIterations[basicNdx];
				iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					iterations.push_back(GatherCubeArgs());
					iterations.back().gatherArgs = basicIterations[basicNdx];
					iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}

	return iterations;
}